

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

Statement *
slang::ast::BlockStatement::fromSyntax
          (Compilation *comp,BlockStatementSyntax *syntax,ASTContext *sourceCtx,
          StatementContext *stmtCtx,bool addInitializers)

{
  SyntaxNode *this;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view arg;
  bool bVar1;
  bool bVar2;
  int iVar3;
  Statement *pSVar4;
  reference ppSVar5;
  StatementSyntax *pSVar6;
  undefined4 extraout_var;
  Compilation *compilation;
  StatementContext *in_RCX;
  void *in_RDX;
  BlockStatementSyntax *in_RSI;
  byte in_R8B;
  BlockStatement *result;
  Statement *stmt;
  SyntaxNode *item;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::SyntaxNode> *__range2;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  bool anyBad;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_Statement_cpp:711:29)>
  guard;
  ProceduralBlockSymbol *proc;
  StatementBlockKind blockKind;
  ASTContext context;
  ASTContext *in_stack_fffffffffffffe18;
  Compilation *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  bitmask<slang::ast::ASTFlags> *in_stack_fffffffffffffe30;
  ASTContext *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined4 in_stack_fffffffffffffe48;
  StatementBlockKind in_stack_fffffffffffffe4c;
  SyntaxNode *syntax_00;
  DiagCode code;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  Compilation *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
  local_178;
  SyntaxList<slang::syntax::SyntaxNode> *local_170;
  bitmask<slang::ast::ASTFlags> local_168 [2];
  SmallVectorBase<const_slang::ast::Statement_*> *in_stack_fffffffffffffea8;
  ASTContext *in_stack_fffffffffffffeb0;
  bitmask<slang::ast::StatementFlags> local_108;
  bitmask<slang::ast::StatementFlags> local_104;
  anon_class_16_2_802c4498_for_func local_100;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_Statement_cpp:711:29)>
  local_f0;
  string_view local_d8;
  SourceRange local_c8;
  undefined4 local_b4;
  ProceduralBlockSymbol *local_b0;
  underlying_type local_a8;
  underlying_type local_a0;
  bitmask<slang::ast::ASTFlags> local_98;
  SourceRange local_90;
  undefined4 local_7c;
  underlying_type local_78;
  StatementBlockKind local_6c;
  sockaddr local_68;
  SyntaxNode SStack_58;
  byte local_29;
  StatementContext *local_28;
  BlockStatementSyntax *local_18;
  Compilation *local_8;
  
  local_29 = in_R8B & 1;
  local_28 = in_RCX;
  local_18 = in_RSI;
  memcpy(&local_68,in_RDX,0x38);
  local_6c = SemanticFacts::getStatementBlockKind(local_18);
  syntax_00 = &SStack_58;
  local_78 = (underlying_type)
             ast::operator|(CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                            (ASTFlags)in_stack_fffffffffffffe20);
  bVar1 = bitmask<slang::ast::ASTFlags>::has
                    (in_stack_fffffffffffffe30,
                     (bitmask<slang::ast::ASTFlags> *)
                     CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  if (bVar1) {
    if ((local_6c == JoinAll) || (local_6c == JoinAny)) {
      local_7c = 0x4d0008;
      local_90 = parsing::Token::range
                           ((Token *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      sourceRange.startLoc._7_1_ = in_stack_fffffffffffffe47;
      sourceRange.startLoc._0_7_ = in_stack_fffffffffffffe40;
      sourceRange.endLoc._0_4_ = in_stack_fffffffffffffe48;
      sourceRange.endLoc._4_4_ = in_stack_fffffffffffffe4c;
      ASTContext::addDiag(in_stack_fffffffffffffe38,SUB84((ulong)syntax_00 >> 0x20,0),sourceRange);
      pSVar4 = Statement::badStmt(in_stack_fffffffffffffe20,(Statement *)in_stack_fffffffffffffe18);
      return pSVar4;
    }
    if (local_6c == JoinNone) {
      local_a0 = (underlying_type)ast::operator~((ASTFlags)in_stack_fffffffffffffe18);
      local_a8 = (underlying_type)ast::operator~((ASTFlags)in_stack_fffffffffffffe18);
      local_98 = bitmask<slang::ast::ASTFlags>::operator&
                           ((bitmask<slang::ast::ASTFlags> *)
                            CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                            (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe20);
      bitmask<slang::ast::ASTFlags>::operator&=
                ((bitmask<slang::ast::ASTFlags> *)&SStack_58,&local_98);
    }
  }
  else if ((local_6c != Sequential) &&
          (bVar1 = ASTContext::inAlwaysCombLatch
                             ((ASTContext *)
                              CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28)), bVar1)
          ) {
    local_b0 = ASTContext::getProceduralBlock(in_stack_fffffffffffffe18);
    code = SUB84((ulong)syntax_00 >> 0x20,0);
    local_b4 = 0x1c0008;
    local_c8 = parsing::Token::range
                         ((Token *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    sourceRange_00.startLoc._7_1_ = in_stack_fffffffffffffe47;
    sourceRange_00.startLoc._0_7_ = in_stack_fffffffffffffe40;
    sourceRange_00.endLoc._0_4_ = in_stack_fffffffffffffe48;
    sourceRange_00.endLoc._4_4_ = in_stack_fffffffffffffe4c;
    ASTContext::addDiag(in_stack_fffffffffffffe38,code,sourceRange_00);
    local_d8 = SemanticFacts::getProcedureKindStr
                         ((ProceduralBlockKind)((ulong)in_stack_fffffffffffffe20 >> 0x20));
    arg._M_str = in_stack_fffffffffffffe70;
    arg._M_len = in_stack_fffffffffffffe68;
    Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffe60,arg);
    pSVar4 = Statement::badStmt(in_stack_fffffffffffffe20,(Statement *)in_stack_fffffffffffffe18);
    return pSVar4;
  }
  local_100.stmtCtx = local_28;
  local_100.savedFlags.m_bits = (local_28->flags).m_bits;
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/Statement.cpp:711:29)>
  ::ScopeGuard(&local_f0,&local_100);
  if (local_6c != Sequential) {
    bitmask<slang::ast::StatementFlags>::bitmask(&local_104,InForkJoin);
    bitmask<slang::ast::StatementFlags>::operator|=(&local_28->flags,&local_104);
    ast::operator|((StatementFlags)in_stack_fffffffffffffe20,
                   (StatementFlags)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    local_108 = bitmask<slang::ast::StatementFlags>::operator~
                          ((bitmask<slang::ast::StatementFlags> *)in_stack_fffffffffffffe18);
    bitmask<slang::ast::StatementFlags>::operator&=(&local_28->flags,&local_108);
  }
  bVar1 = false;
  SmallVector<const_slang::ast::Statement_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Statement_*,_5UL> *)0x12d9ab6);
  if ((local_29 & 1) != 0) {
    Statement::bindScopeInitializers(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  if ((local_6c == JoinAny) || (local_6c == JoinNone)) {
    bitmask<slang::ast::ASTFlags>::bitmask(local_168,ForkJoinAnyNone);
    bitmask<slang::ast::ASTFlags>::operator|=((bitmask<slang::ast::ASTFlags> *)&SStack_58,local_168)
    ;
  }
  local_170 = &local_18->items;
  local_178._M_current =
       (SyntaxNode **)
       std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> *)
                  in_stack_fffffffffffffe18);
  std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::end
            ((span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  while (bVar2 = __gnu_cxx::
                 operator==<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffe20,
                            (__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffe18), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppSVar5 = __gnu_cxx::
              __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
              ::operator*(&local_178);
    this = *ppSVar5;
    bVar2 = slang::syntax::StatementSyntax::isKind(this->kind);
    if (bVar2) {
      pSVar6 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(this);
      iVar3 = Statement::bind((int)pSVar6,&local_68,(socklen_t)local_28);
      pSVar4 = (Statement *)CONCAT44(extraout_var,iVar3);
      SmallVectorBase<const_slang::ast::Statement_*>::push_back
                ((SmallVectorBase<const_slang::ast::Statement_*> *)in_stack_fffffffffffffe20,
                 (Statement **)in_stack_fffffffffffffe18);
      bVar2 = Statement::bad(pSVar4);
      bVar1 = bVar1 || bVar2;
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
    ::operator++(&local_178);
  }
  compilation = (Compilation *)
                createBlockStatement
                          (in_stack_fffffffffffffe60,
                           (SmallVectorBase<const_slang::ast::Statement_*> *)
                           CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),syntax_00,
                           in_stack_fffffffffffffe4c);
  local_8 = compilation;
  if (bVar1) {
    local_8 = (Compilation *)Statement::badStmt(compilation,(Statement *)in_stack_fffffffffffffe18);
  }
  SmallVector<const_slang::ast::Statement_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Statement_*,_5UL> *)0x12d9d0a);
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/Statement.cpp:711:29)>
  ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_Statement_cpp:711:29)>
                 *)compilation);
  return (Statement *)local_8;
}

Assistant:

Statement& BlockStatement::fromSyntax(Compilation& comp, const BlockStatementSyntax& syntax,
                                      const ASTContext& sourceCtx, StatementContext& stmtCtx,
                                      bool addInitializers) {
    ASTContext context = sourceCtx;
    auto blockKind = SemanticFacts::getStatementBlockKind(syntax);
    if (context.flags.has(ASTFlags::Function | ASTFlags::Final)) {
        if (blockKind == StatementBlockKind::JoinAll || blockKind == StatementBlockKind::JoinAny) {
            context.addDiag(diag::TimingInFuncNotAllowed, syntax.end.range());
            return badStmt(comp, nullptr);
        }
        else if (blockKind == StatementBlockKind::JoinNone) {
            // The "function body" flag does not propagate through fork-join_none
            // blocks, as all statements are allowed in those.
            context.flags &= ~ASTFlags::Function & ~ASTFlags::Final;
        }
    }
    else if (blockKind != StatementBlockKind::Sequential && context.inAlwaysCombLatch()) {
        auto proc = context.getProceduralBlock();
        SLANG_ASSERT(proc);
        context.addDiag(diag::ForkJoinAlwaysComb, syntax.begin.range())
            << SemanticFacts::getProcedureKindStr(proc->procedureKind);
        return badStmt(comp, nullptr);
    }

    // When entering a fork-join we clear any active loop flags, since the new
    // forked processes are effectively not in that loop (and statements like
    // continue and break do not apply to the outer loop).
    auto guard = ScopeGuard([&stmtCtx, savedFlags = stmtCtx.flags] {
        const auto savableFlags = StatementFlags::InLoop | StatementFlags::InForLoop |
                                  StatementFlags::InForkJoin;
        stmtCtx.flags &= ~savableFlags;
        stmtCtx.flags |= savedFlags & savableFlags;
    });

    if (blockKind != StatementBlockKind::Sequential) {
        stmtCtx.flags |= StatementFlags::InForkJoin;
        stmtCtx.flags &= ~(StatementFlags::InLoop | StatementFlags::InForLoop);
    }

    bool anyBad = false;
    SmallVector<const Statement*> buffer;

    if (addInitializers)
        bindScopeInitializers(context, buffer);

    if (blockKind == StatementBlockKind::JoinAny || blockKind == StatementBlockKind::JoinNone)
        context.flags |= ASTFlags::ForkJoinAnyNone;

    for (auto item : syntax.items) {
        if (StatementSyntax::isKind(item->kind)) {
            auto& stmt = Statement::bind(item->as<StatementSyntax>(), context, stmtCtx,
                                         /* inList */ true);
            buffer.push_back(&stmt);
            anyBad |= stmt.bad();
        }
    }

    auto result = createBlockStatement(comp, buffer, syntax, blockKind);
    if (anyBad)
        return badStmt(comp, result);

    return *result;
}